

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

void tok_read_defines(tokcxdef *ctx,osfildef *fp,errcxdef *ec)

{
  ushort uVar1;
  ushort uVar2;
  size_t sVar3;
  tokdfdef *__ptr;
  tokdfdef *ptVar4;
  ulong uVar5;
  char buf [4];
  ushort local_40;
  ushort local_3e;
  int local_3c;
  tokdfdef **local_38;
  
  local_38 = ctx->tokcxdf;
  local_3c = 0x40;
  while (sVar3 = fread(&local_40,4,1,(FILE *)fp), uVar2 = local_3e, uVar1 = local_40, sVar3 == 1) {
    if (local_40 == 0) {
      local_38 = local_38 + 1;
      local_3c = local_3c + -1;
      if (local_3c == 0) {
        return;
      }
    }
    else {
      uVar5 = (ulong)local_3e;
      __ptr = (tokdfdef *)
              mchalo(ec,(ulong)((uint)local_40 + (uint)local_3e) + 0x1f,"tok_read_defines");
      __ptr->explen = (uint)uVar2;
      __ptr->nm = __ptr->expan + uVar5;
      __ptr->len = (uint)uVar1;
      sVar3 = fread(__ptr->expan + uVar5,(ulong)(uint)uVar1,1,(FILE *)fp);
      if ((sVar3 != 1) ||
         (((long)__ptr->explen != 0 &&
          (sVar3 = fread(__ptr->expan,(long)__ptr->explen,1,(FILE *)fp), sVar3 != 1)))) break;
      ptVar4 = tok_find_define(ctx,__ptr->nm,__ptr->len);
      if (ptVar4 == (tokdfdef *)0x0) {
        __ptr->nxt = *local_38;
        *local_38 = __ptr;
      }
      else {
        free(__ptr);
      }
    }
  }
  errsigf(ec,"TADS",0x25f);
}

Assistant:

void tok_read_defines(tokcxdef *ctx, osfildef *fp, errcxdef *ec)
{
    int        i;
    tokdfdef **dfp;
    tokdfdef  *df;
    char       buf[4];

    /* write each element of the hash chains */
    for (i = TOKDFHSHSIZ, dfp = ctx->tokcxdf ; i ; ++dfp, --i)
    {
        /* read this hash chain */
        for (;;)
        {
            /* read the next entry's header, and stop if this is the end */
            if (osfrb(fp, buf, 4)) errsig(ec, ERR_RDGAM);
            if (osrp2(buf) == 0) break;

            /* set up a new symbol of the appropriate size */
            df = (tokdfdef *)mchalo(ec,
                                    (sizeof(tokdfdef) + osrp2(buf)
                                     + osrp2(buf+2) - 1),
                                    "tok_read_defines");
            df->explen = osrp2(buf+2);
            df->nm = df->expan + df->explen;
            df->len = osrp2(buf);

            /* read the rest of the symbol */
            if (osfrb(fp, df->nm, df->len)
                || (df->explen != 0 && osfrb(fp, df->expan, df->explen)))
                errsig(ec, ERR_RDGAM);

            /*
             *   If a symbol with this name already exists in the table,
             *   discard the new one -- the symbols defined by -D and the
             *   current set of built-in symbols takes precedence over the
             *   set loaded from the file.  
             */
            if (tok_find_define(ctx, df->nm, df->len))
            {
                /* simply discard this symbol */
                mchfre(df);
            }
            else
            {
                /* link it into this hash chain */
                df->nxt = *dfp;
                *dfp = df;
            }
        }
    }
}